

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_acl_nfs4.c
# Opt level: O1

void compare_acls(archive_entry *ae,acl_t *acls,int n,int mode)

{
  bool bVar1;
  undefined1 auVar2 [16];
  wchar_t wVar3;
  int iVar4;
  mode_t mVar5;
  ulong uVar6;
  char *pcVar7;
  int *piVar8;
  long lVar9;
  wchar_t wVar10;
  uint uVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int permset;
  int qual;
  int tag;
  int type;
  char *name;
  wchar_t local_8c;
  wchar_t local_88;
  wchar_t local_84;
  wchar_t local_80;
  uint local_7c;
  int *local_78;
  archive_entry *local_70;
  char *local_68;
  uint local_5c;
  wchar_t local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  wchar_t local_44;
  char *local_40;
  ulong local_38;
  
  local_7c = mode;
  local_70 = ae;
  local_78 = (int *)malloc((ulong)(uint)n * 4);
  auVar2 = _DAT_0023d020;
  if (0 < n) {
    lVar9 = (ulong)(uint)n - 1;
    auVar13._8_4_ = (int)lVar9;
    auVar13._0_8_ = lVar9;
    auVar13._12_4_ = (int)((ulong)lVar9 >> 0x20);
    uVar6 = 0;
    auVar13 = auVar13 ^ _DAT_0023d020;
    auVar14 = _DAT_0023d010;
    do {
      auVar15 = auVar14 ^ auVar2;
      if ((bool)(~(auVar15._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar15._0_4_ ||
                  auVar13._4_4_ < auVar15._4_4_) & 1)) {
        local_78[uVar6] = (int)uVar6;
      }
      if ((auVar15._12_4_ != auVar13._12_4_ || auVar15._8_4_ <= auVar13._8_4_) &&
          auVar15._12_4_ <= auVar13._12_4_) {
        local_78[uVar6 + 1] = (int)uVar6 + 1;
      }
      uVar6 = uVar6 + 2;
      lVar9 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 2;
      auVar14._8_8_ = lVar9 + 2;
    } while ((n + 1U & 0xfffffffe) != uVar6);
  }
  wVar3 = archive_entry_acl_next(local_70,L'Ā',&local_80,&local_8c,&local_84,&local_88,&local_68);
  if (wVar3 == L'\0') {
    local_44 = local_7c & 7;
    local_48 = local_7c >> 3 & 7;
    local_4c = local_7c & 0x38;
    local_50 = local_7c >> 6 & 7;
    local_54 = local_7c & 0x1c0;
    do {
      wVar10 = local_80;
      wVar3 = local_8c;
      if (n < 1) {
        bVar12 = true;
        wVar3 = L'\0';
      }
      else {
        uVar6 = (ulong)(uint)local_84;
        bVar1 = false;
        lVar9 = 1;
        uVar11 = local_84 + L'\xffffd8ee';
        piVar8 = local_78;
        local_40 = local_68;
        local_58 = local_88;
        do {
          iVar4 = piVar8[lVar9 + -1];
          if (((acls[iVar4].type == wVar10) && (acls[iVar4].permset == wVar3)) &&
             (acls[iVar4].tag == (int)uVar6)) {
            if ((uVar11 < 5) && ((0x15U >> (uVar11 & 0x1f) & 1) != 0)) {
LAB_001205c6:
              piVar8[lVar9 + -1] = piVar8[(long)n + -1];
              n = n + -1;
              bVar1 = true;
            }
            else if (acls[iVar4].qual == local_58) {
              pcVar7 = acls[iVar4].name;
              if (local_40 == (char *)0x0) {
                if (pcVar7 == (char *)0x0) goto LAB_001205c6;
                bVar12 = *pcVar7 == '\0';
              }
              else if (pcVar7 == (char *)0x0) {
                bVar12 = *local_40 == '\0';
              }
              else {
                local_5c = uVar11;
                local_38 = uVar6;
                iVar4 = strcmp(local_40,pcVar7);
                bVar12 = iVar4 == 0;
                piVar8 = local_78;
                uVar6 = local_38;
                uVar11 = local_5c;
              }
              if (bVar12) goto LAB_001205c6;
            }
          }
          bVar12 = !bVar1;
        } while ((lVar9 < n) && (lVar9 = lVar9 + 1, !bVar1));
        wVar3 = (wchar_t)bVar1;
      }
      if (local_84 == L'✖') {
        if (bVar12) {
          puts("No match for other perm");
        }
        wVar3 = local_44;
        failure("OTHER permset (%02o) != other mode (%02o)",(ulong)(uint)local_8c,
                (ulong)(uint)local_44);
        wVar3 = (wchar_t)(local_8c == wVar3);
        wVar10 = L'½';
        pcVar7 = "(permset << 0) == (mode & 0007)";
      }
      else if (local_84 == L'✔') {
        if (bVar12) {
          puts("No match for group_obj perm");
        }
        failure("GROUP_OBJ permset %02o != group mode %02o",(ulong)(uint)local_8c,(ulong)local_48);
        wVar3 = (wchar_t)(local_8c << 3 == local_4c);
        wVar10 = L'¸';
        pcVar7 = "(permset << 3) == (mode & 0070)";
      }
      else if (local_84 == L'✒') {
        if (bVar12) {
          puts("No match for user_obj perm");
        }
        failure("USER_OBJ permset (%02o) != user mode (%02o)",(ulong)(uint)local_8c,(ulong)local_50)
        ;
        wVar3 = (wchar_t)(local_8c << 6 == local_54);
        wVar10 = L'³';
        pcVar7 = "(permset << 6) == (mode & 0700)";
      }
      else {
        failure("Could not find match for ACL (type=%d,permset=%d,tag=%d,qual=%d,name=``%s\'\')",
                (ulong)(uint)local_80,(ulong)(uint)local_8c,(ulong)(uint)local_84,
                (ulong)(uint)local_88,local_68);
        wVar10 = L'Â';
        pcVar7 = "matched == 1";
      }
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_posix1e.c"
                       ,wVar10,wVar3,pcVar7,(void *)0x0);
      wVar3 = archive_entry_acl_next
                        (local_70,L'Ā',&local_80,&local_8c,&local_84,&local_88,&local_68);
    } while (wVar3 == L'\0');
  }
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_posix1e.c"
                      ,L'Å',1,"ARCHIVE_EOF",(long)wVar3,"r",(void *)0x0);
  mVar5 = archive_entry_mode(local_70);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_posix1e.c"
                   ,L'Æ',(uint)(((mVar5 ^ local_7c) & 0x1ff) == 0),
                   "(mode_t)(mode & 0777) == (archive_entry_mode(ae) & 0777)",(void *)0x0);
  piVar8 = local_78;
  iVar4 = *local_78;
  failure("Could not find match for ACL (type=%d,permset=%d,tag=%d,qual=%d,name=``%s\'\')",
          (ulong)(uint)acls[iVar4].type,(ulong)(uint)acls[iVar4].permset,
          (ulong)(uint)acls[iVar4].tag,(ulong)(uint)acls[iVar4].qual,acls[iVar4].name);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_posix1e.c"
                   ,L'Ë',(uint)(n == 0),"n == 0",(void *)0x0);
  free(piVar8);
  return;
}

Assistant:

static void
compare_acls(struct archive_entry *ae, struct acl_t *acls, int n)
{
	int *marker = malloc(sizeof(marker[0]) * n);
	int i;
	int r;
	int type, permset, tag, qual;
	int matched;
	const char *name;

	for (i = 0; i < n; i++)
		marker[i] = i;

	while (0 == (r = archive_entry_acl_next(ae,
			 ARCHIVE_ENTRY_ACL_TYPE_NFS4,
			 &type, &permset, &tag, &qual, &name))) {
		for (i = 0, matched = 0; i < n && !matched; i++) {
			if (acl_match(&acls[marker[i]], type, permset,
				tag, qual, name)) {
				/* We found a match; remove it. */
				marker[i] = marker[n - 1];
				n--;
				matched = 1;
			}
		}
		failure("Could not find match for ACL "
		    "(type=%d,permset=%d,tag=%d,qual=%d,name=``%s'')",
		    type, permset, tag, qual, name);
		assertEqualInt(1, matched);
	}
	assertEqualInt(ARCHIVE_EOF, r);
	failure("Could not find match for ACL "
	    "(type=%d,permset=%d,tag=%d,qual=%d,name=``%s'')",
	    acls[marker[0]].type, acls[marker[0]].permset,
	    acls[marker[0]].tag, acls[marker[0]].qual, acls[marker[0]].name);
	assertEqualInt(0, n); /* Number of ACLs not matched should == 0 */
	free(marker);
}